

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCalculator.cpp
# Opt level: O2

void __thiscall
tiger::trains::ai::PathCalculator::PathCalculator
          (PathCalculator *this,Train *train,BotSharedData *sharedData)

{
  _Rb_tree_header *p_Var1;
  
  this->train = train;
  this->sharedData = sharedData;
  p_Var1 = &(this->minLen)._M_t._M_impl.super__Rb_tree_header;
  (this->minLen)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->minLen)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->minLen)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->minLen)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->minLen)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ancestors)._M_t._M_impl.super__Rb_tree_header;
  (this->ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ancestors)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

PathCalculator::PathCalculator(world::Train *train, BotSharedData *sharedData)
    : train(train), sharedData(sharedData)
{

}